

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

void __thiscall
capnp::writeMessage(capnp *this,OutputStream *output,
                   ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  undefined8 uVar1;
  bool bVar2;
  size_t sVar3;
  kj *pkVar4;
  DirectWireValue<unsigned_int> *pDVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  ArrayPtr<const_unsigned_char> *pAVar7;
  size_t size;
  size_t size_00;
  ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> AVar8;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> AVar9;
  ArrayPtr<const_unsigned_char> AVar10;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> AVar11;
  ArrayPtr<const_unsigned_char> *local_238;
  uint local_194;
  undefined1 auStack_190 [4];
  uint i_1;
  size_t local_188;
  ArrayPtr<const_unsigned_char> local_180;
  undefined1 local_170 [8];
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> pieces;
  Array<kj::ArrayPtr<const_unsigned_char>_> pieces_heap;
  ArrayPtr<const_unsigned_char> pieces_stack [4];
  bool pieces_isOnStack;
  size_t pieces_size;
  undefined1 auStack_f0 [4];
  uint i;
  ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> table;
  Array<capnp::_::DirectWireValue<unsigned_int>_> table_heap;
  WireValue<uint32_t>_conflict table_stack [16];
  bool table_isOnStack;
  size_t table_size;
  Fault local_68;
  Fault f;
  size_t local_58;
  DebugExpression<unsigned_long> local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  OutputStream *output_local;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  
  segments_local.ptr = segments.ptr;
  _kjCondition._32_8_ = this;
  output_local = output;
  local_58 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
  local_50 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_48,&local_50,
             (int *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar2) {
    sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
    pkVar4 = (kj *)(sVar3 + 2 & 0xfffffffffffffffe);
    if (pkVar4 < (kj *)0x11) {
      kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::Array
                ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&table.size_,(void *)0x0);
      AVar8 = kj::arrayPtr<capnp::_::DirectWireValue<unsigned_int>>
                        ((DirectWireValue<unsigned_int> *)&table_heap.disposer,(size_t)pkVar4);
    }
    else {
      kj::heapArray<capnp::_::DirectWireValue<unsigned_int>>
                ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&table.size_,pkVar4,size);
      AVar8 = kj::Array::operator_cast_to_ArrayPtr((Array *)&table.size_);
    }
    table.ptr = (DirectWireValue<unsigned_int> *)AVar8.size_;
    _auStack_f0 = AVar8.ptr;
    pDVar5 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                       ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_f0,0);
    sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
    _::DirectWireValue<unsigned_int>::set(pDVar5,(int)sVar3 - 1);
    for (pieces_size._4_4_ = 0;
        sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                          ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local),
        pieces_size._4_4_ < sVar3; pieces_size._4_4_ = pieces_size._4_4_ + 1) {
      pDVar5 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                         ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_f0,
                          (ulong)(pieces_size._4_4_ + 1));
      pAVar6 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local,
                          (ulong)pieces_size._4_4_);
      sVar3 = kj::ArrayPtr<const_capnp::word>::size(pAVar6);
      _::DirectWireValue<unsigned_int>::set(pDVar5,(uint)sVar3);
    }
    sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
    if ((sVar3 & 1) == 0) {
      sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
      pDVar5 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                         ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_f0,sVar3 + 1
                         );
      _::DirectWireValue<unsigned_int>::set(pDVar5,0);
    }
    sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
    pkVar4 = (kj *)(sVar3 + 1);
    pieces_stack[3].size_._7_1_ = pkVar4 < (kj *)0x5;
    local_238 = (ArrayPtr<const_unsigned_char> *)&pieces_heap.disposer;
    do {
      kj::ArrayPtr<const_unsigned_char>::ArrayPtr(local_238);
      local_238 = local_238 + 1;
    } while (local_238 != (ArrayPtr<const_unsigned_char> *)&pieces_stack[3].size_);
    if ((pieces_stack[3].size_._7_1_ & 1) == 0) {
      kj::heapArray<kj::ArrayPtr<unsigned_char_const>>
                ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&pieces.size_,pkVar4,size_00);
    }
    else {
      kj::Array<kj::ArrayPtr<const_unsigned_char>_>::Array
                ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&pieces.size_,(void *)0x0);
    }
    if ((pieces_stack[3].size_._7_1_ & 1) == 0) {
      AVar9 = kj::Array::operator_cast_to_ArrayPtr((Array *)&pieces.size_);
    }
    else {
      AVar9 = kj::arrayPtr<kj::ArrayPtr<unsigned_char_const>>
                        ((ArrayPtr<const_unsigned_char> *)&pieces_heap.disposer,(size_t)pkVar4);
    }
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)AVar9.size_;
    local_170 = (undefined1  [8])AVar9.ptr;
    _auStack_190 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::asBytes
                             ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_f0);
    local_180 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)auStack_190);
    pAVar7 = kj::ArrayPtr<kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> *)local_170,0);
    *pAVar7 = local_180;
    local_194 = 0;
    while( true ) {
      sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local);
      uVar1 = _kjCondition._32_8_;
      if (sVar3 <= local_194) break;
      pAVar6 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&output_local,
                          (ulong)local_194);
      AVar10 = kj::ArrayPtr<const_capnp::word>::asBytes(pAVar6);
      pAVar7 = kj::ArrayPtr<kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> *)local_170,
                          (ulong)(local_194 + 1));
      *pAVar7 = AVar10;
      local_194 = local_194 + 1;
    }
    AVar11 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_170);
    (**(code **)(*(long *)uVar1 + 0x18))(uVar1,AVar11.ptr,AVar11.size_);
    kj::Array<kj::ArrayPtr<const_unsigned_char>_>::~Array
              ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&pieces.size_);
    kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::~Array
              ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&table.size_);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[42]>
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
             ,0x129,FAILED,"segments.size() > 0",
             "_kjCondition,\"Tried to serialize uninitialized message.\"",
             (DebugComparison<unsigned_long,_int> *)local_48,
             (char (*) [42])"Tried to serialize uninitialized message.");
  kj::_::Debug::Fault::fatal(&local_68);
}

Assistant:

void writeMessage(kj::OutputStream& output, kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_REQUIRE(segments.size() > 0, "Tried to serialize uninitialized message.");

  KJ_STACK_ARRAY(_::WireValue<uint32_t>, table, (segments.size() + 2) & ~size_t(1), 16, 64);

  // We write the segment count - 1 because this makes the first word zero for single-segment
  // messages, improving compression.  We don't bother doing this with segment sizes because
  // one-word segments are rare anyway.
  table[0].set(segments.size() - 1);
  for (uint i = 0; i < segments.size(); i++) {
    table[i + 1].set(segments[i].size());
  }
  if (segments.size() % 2 == 0) {
    // Set padding byte.
    table[segments.size() + 1].set(0);
  }

  KJ_STACK_ARRAY(kj::ArrayPtr<const byte>, pieces, segments.size() + 1, 4, 32);
  pieces[0] = table.asBytes();

  for (uint i = 0; i < segments.size(); i++) {
    pieces[i + 1] = segments[i].asBytes();
  }

  output.write(pieces);
}